

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O1

PyObject * libxml_xmlCheckUTF8(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  uchar *utf;
  undefined8 local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"z:xmlCheckUTF8",&local_10);
  if (iVar1 != 0) {
    iVar1 = xmlCheckUTF8(local_10);
    pPVar2 = libxml_intWrap(iVar1);
  }
  return pPVar2;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlCheckUTF8(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    unsigned char * utf;

    if (!PyArg_ParseTuple(args, (char *)"z:xmlCheckUTF8", &utf))
        return(NULL);

    c_retval = xmlCheckUTF8(utf);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}